

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TexImage2DAlignCase::createTexture(TexImage2DAlignCase *this)

{
  ContextWrapper *this_00;
  TextureFormatInfo *b;
  int iVar1;
  int level;
  uint height;
  uint width;
  uint uVar2;
  uint rowPitch;
  deUint32 tex;
  TextureFormat *local_d8;
  Vec4 *local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Vector<float,_4> local_a8;
  Vec4 colorB;
  Vector<float,_4> local_78;
  Vec4 colorA;
  tcu local_58 [40];
  
  tex = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  b = &(this->super_Texture2DSpecCase).m_texFormatInfo;
  local_d0 = &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax;
  local_d8 = &(this->super_Texture2DSpecCase).m_texFormat;
  for (level = 0; level < (this->super_Texture2DSpecCase).m_numLevels; level = level + 1) {
    width = (this->super_Texture2DSpecCase).m_width >> ((byte)level & 0x1f);
    if ((int)width < 2) {
      width = 1;
    }
    height = (this->super_Texture2DSpecCase).m_height >> ((byte)level & 0x1f);
    if ((int)height < 2) {
      height = 1;
    }
    colorB.m_data[0] = 1.0;
    colorB.m_data[1] = 0.0;
    colorB.m_data[2] = 0.0;
    colorB.m_data[3] = 1.0;
    tcu::operator-((tcu *)&local_a8,local_d0,&b->valueMin);
    tcu::operator*(local_58,&colorB,&local_a8);
    tcu::operator+((tcu *)&colorA,(Vector<float,_4> *)local_58,&b->valueMin);
    local_a8.m_data[0] = 0.0;
    local_a8.m_data[1] = 1.0;
    local_a8.m_data[2] = 0.0;
    local_a8.m_data[3] = 1.0;
    tcu::operator-((tcu *)&local_78,local_d0,&b->valueMin);
    tcu::operator*(local_58,&local_a8,&local_78);
    tcu::operator+((tcu *)&colorB,(Vector<float,_4> *)local_58,&b->valueMin);
    iVar1 = tcu::TextureFormat::getPixelSize(local_d8);
    rowPitch = -this->m_alignment & (iVar1 * width + this->m_alignment) - 1;
    uVar2 = height >> 2;
    if (width >> 2 < height >> 2) {
      uVar2 = width >> 2;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&data,(long)(int)(rowPitch * height));
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_58,local_d8,width,height,1,rowPitch,0,
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    tcu::fillWithGrid((PixelBufferAccess *)local_58,uVar2 + (uVar2 == 0),&colorA,&colorB);
    sglr::ContextWrapper::glTexImage2D
              (this_00,0xde1,level,*(int *)&(this->super_Texture2DSpecCase).field_0xd4,width,height,
               0,this->m_format,this->m_dataType,
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		vector<deUint8>		data;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			int		rowPitch	= deAlign32(levelW*m_texFormat.getPixelSize(), m_alignment);
			int		cellSize	= de::max(1, de::min(levelW >> 2, levelH >> 2));

			data.resize(rowPitch*levelH);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, levelW, levelH, 1, rowPitch, 0, &data[0]), cellSize, colorA, colorB);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, levelW, levelH, 0, m_format, m_dataType, &data[0]);
		}
	}